

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HumanDetectorTest.cpp
# Opt level: O2

void __thiscall
humanDetector_should_reduce_boundary_Test::humanDetector_should_reduce_boundary_Test
          (humanDetector_should_reduce_boundary_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_00183df8;
  return;
}

Assistant:

TEST(humanDetector, should_reduce_boundary) {
  HumanDetector detector;
  cv::Rect r1(414, 0, 321, 642);
  cv::Rect r2(446, 45, 257, 514);
  std::vector < cv::Rect > expected;
  std::vector < cv::Rect > input;
  expected.push_back(r2);
  input.push_back(r1);
  EXPECT_EQ(expected, detector.improveBoundary(input));
}